

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O3

int Extra_ThreshInitializeChow(int nVars,int *pChow)

{
  ulong uVar1;
  int iVar2;
  int Aux [16];
  int local_48 [16];
  
  if (nVars < 1) {
    iVar2 = 1;
  }
  else {
    uVar1 = 0;
    iVar2 = 0;
    do {
      if (uVar1 != 0) {
        iVar2 = iVar2 + (uint)(pChow[uVar1] != pChow[uVar1 - 1]);
      }
      local_48[uVar1] = iVar2;
      uVar1 = uVar1 + 1;
    } while ((uint)nVars != uVar1);
    iVar2 = iVar2 + 1;
    if (0 < nVars) {
      memcpy(pChow,local_48,(ulong)(uint)nVars << 2);
    }
  }
  return iVar2;
}

Assistant:

int Extra_ThreshInitializeChow(int nVars, int * pChow) {
    int i = 0, Aux[16], nChows = 0;
    //group the variables which have the same Chow
    for (i = 0; i < nVars; i++) {
        if (i == 0 || (pChow[i] == pChow[i - 1]))
            Aux[i] = nChows;
        else {
            nChows++;
            Aux[i] = nChows;
        }
    }
    for (i = 0; i < nVars; i++)
        pChow[i] = Aux[i];
    nChows++;
    return nChows;

}